

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdPackage.cpp
# Opt level: O3

PackageSymbol * slang::ast::builtins::createStdPackage(Compilation *c)

{
  Scope *pSVar1;
  Type *retType;
  Segment *pSVar2;
  undefined6 uVar3;
  ClassType *pCVar4;
  PackageSymbol *pPVar5;
  EnumValueSymbol *this;
  TransparentMemberSymbol *member;
  TypeAliasType *retType_00;
  Type *pTVar6;
  GenericClassDefSymbol *pGVar7;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar8;
  long lVar9;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view name_13;
  string_view name_14;
  string_view name_15;
  string_view name_16;
  string_view name_17;
  string_view name_18;
  string_view name_19;
  string_view name_20;
  string_view name_21;
  string_view name_22;
  string_view name_23;
  ClassBuilder builder;
  MethodBuilder self;
  MethodBuilder srandom;
  MethodBuilder set_randstate;
  char *name;
  MethodBuilder try_get;
  MethodBuilder get;
  ClassBuilder local_3c0;
  Scope *local_3b0;
  _Storage<slang::SVInt,_false> local_3a8;
  char local_398;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_390;
  undefined1 local_370;
  PackageSymbol *local_368;
  EnumType *local_360;
  _Storage<slang::SVInt,_false> local_358;
  char local_348;
  anon_union_8_3_62382250_for_ParameterDecl_0 local_340;
  uint local_338;
  undefined1 uStack_334;
  byte bStack_333;
  undefined2 uStack_332;
  Scope *local_2f0;
  _Storage<slang::SVInt,_false> local_2e8;
  char local_2d8;
  _Storage<slang::SVInt,_false> local_298;
  char local_288;
  _Storage<slang::SVInt,_false> local_248;
  char local_238;
  _Storage<slang::SVInt,_false> local_1f8;
  char local_1e8;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_1a8;
  uint local_1a0;
  ushort local_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  MethodBuilder local_170;
  MethodBuilder local_120;
  MethodBuilder local_d0;
  MethodBuilder local_80;
  
  local_340._0_4_ = 1;
  local_368 = BumpAllocator::
              emplace<slang::ast::PackageSymbol,slang::ast::Compilation&,char_const(&)[4],slang::SourceLocation_const&,slang::ast::NetType_const&,slang::ast::VariableLifetime>
                        (&c->super_BumpAllocator,c,(char (*) [4])0x48d1ee,
                         (SourceLocation *)&SourceLocation::NoLocation,c->wireNetType,
                         (VariableLifetime *)&local_340);
  local_3b0 = &local_368->super_Scope;
  name_08._M_str = "process";
  name_08._M_len = 7;
  ClassBuilder::ClassBuilder(&local_3c0,c,name_08);
  (local_3c0.type)->isAbstract = true;
  (local_3c0.type)->isFinal = true;
  local_1a8.pVal = (uint64_t *)&(local_3c0.type)->super_Scope;
  local_1a0 = 1;
  local_198 = 0;
  uStack_190 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_178 = 0;
  local_360 = BumpAllocator::
              emplace<slang::ast::EnumType,slang::ast::Compilation&,slang::SourceLocation_const&,slang::ast::Type_const&,slang::ast::ASTContext&>
                        (&c->super_BumpAllocator,c,(SourceLocation *)&SourceLocation::NoLocation,
                         c->intType,(ASTContext *)&local_1a8);
  local_360->systemId = 0x7ffff7ff;
  local_2f0 = &local_360->super_Scope;
  aVar8.valueSyntax = (ParameterDeclarationSyntax *)0x0;
  lVar9 = 0;
  do {
    local_120.compilation = *(Compilation **)((long)&PTR_anon_var_dwarf_166086a_005ea4c8 + lVar9);
    this = BumpAllocator::
           emplace<slang::ast::EnumValueSymbol,char_const*&,slang::SourceLocation_const&>
                     (&c->super_BumpAllocator,(char **)&local_120,
                      (SourceLocation *)&SourceLocation::NoLocation);
    (this->super_ValueSymbol).declaredType.type = (Type *)local_360;
    Scope::insertMember(local_2f0,(Symbol *)this,(local_360->super_Scope).lastMember,false,true);
    local_338 = 0x20;
    uStack_334 = 1;
    bStack_333 = 0;
    local_340 = aVar8;
    SVInt::clearUnusedBits((SVInt *)&local_340);
    local_390._0_8_ = local_340;
    local_390._8_4_ = local_338;
    local_390._13_1_ = bStack_333;
    local_390._12_1_ = uStack_334;
    if (0x40 < local_338 || (bStack_333 & 1) != 0) {
      local_340.valueSyntax = (ParameterDeclarationSyntax *)0x0;
    }
    local_370 = 1;
    EnumValueSymbol::setValue(this,(ConstantValue *)&local_390);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_390);
    if (((0x40 < local_338) || ((bStack_333 & 1) != 0)) &&
       (local_340.valueSyntax != (ParameterDeclarationSyntax *)0x0)) {
      operator_delete__(local_340.valueSyntax);
    }
    pCVar4 = local_3c0.type;
    pSVar1 = &(local_3c0.type)->super_Scope;
    member = BumpAllocator::
             emplace<slang::ast::TransparentMemberSymbol,slang::ast::EnumValueSymbol&>
                       (&c->super_BumpAllocator,this);
    Scope::insertMember(pSVar1,&member->super_Symbol,(pCVar4->super_Scope).lastMember,false,true);
    lVar9 = lVar9 + 8;
    aVar8.valueSyntax =
         (ParameterDeclarationSyntax *)
         ((long)&((aVar8.valueSyntax)->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.kind +
         1);
  } while (lVar9 != 0x28);
  retType_00 = BumpAllocator::
               emplace<slang::ast::TypeAliasType,char_const(&)[6],slang::SourceLocation_const&>
                         (&c->super_BumpAllocator,(char (*) [6])0x48ec9c,
                          (SourceLocation *)&SourceLocation::NoLocation);
  (retType_00->targetType).type = (Type *)local_360;
  Scope::insertMember(&(local_3c0.type)->super_Scope,(Symbol *)retType_00,
                      ((local_3c0.type)->super_Scope).lastMember,false,true);
  pTVar6 = c->voidType;
  name_09._M_str = "self";
  name_09._M_len = 4;
  ClassBuilder::addMethod
            ((MethodBuilder *)&local_340,&local_3c0,name_09,&(local_3c0.type)->super_Type,Function);
  MethodBuilder::addFlags((MethodBuilder *)&local_340,(bitmask<slang::ast::MethodFlags>)0x4);
  name_10._M_str = "status";
  name_10._M_len = 6;
  ClassBuilder::addMethod(&local_120,&local_3c0,name_10,&retType_00->super_Type,Function);
  MethodBuilder::~MethodBuilder(&local_120);
  name_11._M_str = "kill";
  name_11._M_len = 4;
  ClassBuilder::addMethod(&local_80,&local_3c0,name_11,pTVar6,Function);
  MethodBuilder::~MethodBuilder(&local_80);
  name_12._M_str = "await";
  name_12._M_len = 5;
  ClassBuilder::addMethod(&local_d0,&local_3c0,name_12,pTVar6,Task);
  MethodBuilder::~MethodBuilder(&local_d0);
  name_13._M_str = "suspend";
  name_13._M_len = 7;
  ClassBuilder::addMethod((MethodBuilder *)&local_1f8._M_value,&local_3c0,name_13,pTVar6,Function);
  MethodBuilder::~MethodBuilder((MethodBuilder *)&local_1f8._M_value);
  name_14._M_str = "resume";
  name_14._M_len = 6;
  ClassBuilder::addMethod((MethodBuilder *)&local_248._M_value,&local_3c0,name_14,pTVar6,Function);
  MethodBuilder::~MethodBuilder((MethodBuilder *)&local_248._M_value);
  name_15._M_str = "get_randstate";
  name_15._M_len = 0xd;
  ClassBuilder::addMethod
            ((MethodBuilder *)&local_298._M_value,&local_3c0,name_15,c->stringType,Function);
  MethodBuilder::~MethodBuilder((MethodBuilder *)&local_298._M_value);
  name_16._M_str = "srandom";
  name_16._M_len = 7;
  ClassBuilder::addMethod((MethodBuilder *)&local_2e8._M_value,&local_3c0,name_16,pTVar6,Function);
  pPVar5 = local_368;
  local_398 = '\0';
  name_00._M_str = "seed";
  name_00._M_len = 4;
  MethodBuilder::addArg
            ((MethodBuilder *)&local_2e8._M_value,name_00,c->intType,In,
             (optional<slang::SVInt> *)&local_3a8._M_value);
  pSVar1 = local_3b0;
  if (((local_398 == '\x01') &&
      ((local_398 = '\0', 0x40 < local_3a8._M_value.super_SVIntStorage.bitWidth ||
       ((local_3a8._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)))) &&
     (local_3a8._M_value.super_SVIntStorage.field_0.val != 0)) {
    operator_delete__((void *)local_3a8._M_value.super_SVIntStorage.field_0);
  }
  name_17._M_str = "set_randstate";
  name_17._M_len = 0xd;
  ClassBuilder::addMethod(&local_170,&local_3c0,name_17,pTVar6,Function);
  local_348 = '\0';
  name_01._M_str = "state";
  name_01._M_len = 5;
  MethodBuilder::addArg
            (&local_170,name_01,c->stringType,In,(optional<slang::SVInt> *)&local_358._M_value);
  if (((local_348 == '\x01') &&
      ((local_348 = '\0', 0x40 < local_358._M_value.super_SVIntStorage.bitWidth ||
       ((local_358._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)))) &&
     (local_358._M_value.super_SVIntStorage.field_0.val != 0)) {
    operator_delete__((void *)local_358._M_value.super_SVIntStorage.field_0);
  }
  MethodBuilder::~MethodBuilder(&local_170);
  MethodBuilder::~MethodBuilder((MethodBuilder *)&local_2e8._M_value);
  MethodBuilder::~MethodBuilder((MethodBuilder *)&local_340);
  Scope::insertMember(pSVar1,(Symbol *)local_3c0.type,(pPVar5->super_Scope).lastMember,false,true);
  name_18._M_str = "semaphore";
  name_18._M_len = 9;
  ClassBuilder::ClassBuilder((ClassBuilder *)&local_170,c,name_18);
  pTVar6 = c->intType;
  retType = c->voidType;
  local_1a0 = 0x20;
  local_19c = 1;
  local_1a8.val = 0;
  SVInt::clearUnusedBits((SVInt *)&local_1a8);
  local_390._8_4_ = 0x20;
  local_390._12_2_ = 1;
  local_390._0_8_ = (void *)0x1;
  SVInt::clearUnusedBits((SVInt *)&local_390);
  name_19._M_str = "new";
  name_19._M_len = 3;
  ClassBuilder::addMethod
            ((MethodBuilder *)&local_340,(ClassBuilder *)&local_170,name_19,retType,Function);
  MethodBuilder::addFlags((MethodBuilder *)&local_340,(bitmask<slang::ast::MethodFlags>)0x8);
  SVInt::SVInt(&local_1f8._M_value,(SVIntStorage *)&local_1a8);
  local_1e8 = '\x01';
  name_02._M_str = "keyCount";
  name_02._M_len = 8;
  MethodBuilder::addArg
            ((MethodBuilder *)&local_340,name_02,pTVar6,In,
             (optional<slang::SVInt> *)&local_1f8._M_value);
  if ((local_1e8 == '\x01') &&
     (((local_1e8 = '\0', 0x40 < local_1f8._M_value.super_SVIntStorage.bitWidth ||
       ((local_1f8._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)) &&
      (local_1f8._M_value.super_SVIntStorage.field_0.val != 0)))) {
    operator_delete__((void *)local_1f8._M_value.super_SVIntStorage.field_0);
  }
  name_20._M_str = "put";
  name_20._M_len = 3;
  ClassBuilder::addMethod(&local_120,(ClassBuilder *)&local_170,name_20,retType,Function);
  SVInt::SVInt(&local_248._M_value,(SVIntStorage *)&local_390);
  local_238 = '\x01';
  name_03._M_str = "keyCount";
  name_03._M_len = 8;
  MethodBuilder::addArg(&local_120,name_03,pTVar6,In,(optional<slang::SVInt> *)&local_248._M_value);
  if (((local_238 == '\x01') &&
      ((local_238 = '\0', 0x40 < local_248._M_value.super_SVIntStorage.bitWidth ||
       ((local_248._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)))) &&
     (local_248._M_value.super_SVIntStorage.field_0.val != 0)) {
    operator_delete__((void *)local_248._M_value.super_SVIntStorage.field_0);
  }
  name_21._M_str = "get";
  name_21._M_len = 3;
  ClassBuilder::addMethod(&local_80,(ClassBuilder *)&local_170,name_21,retType,Task);
  SVInt::SVInt(&local_298._M_value,(SVIntStorage *)&local_390);
  local_288 = '\x01';
  name_04._M_str = "keyCount";
  name_04._M_len = 8;
  MethodBuilder::addArg(&local_80,name_04,pTVar6,In,(optional<slang::SVInt> *)&local_298._M_value);
  if (((local_288 == '\x01') &&
      ((local_288 = '\0', 0x40 < local_298._M_value.super_SVIntStorage.bitWidth ||
       ((local_298._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)))) &&
     (local_298._M_value.super_SVIntStorage.field_0.val != 0)) {
    operator_delete__((void *)local_298._M_value.super_SVIntStorage.field_0);
  }
  name_22._M_str = "try_get";
  name_22._M_len = 7;
  ClassBuilder::addMethod(&local_d0,(ClassBuilder *)&local_170,name_22,pTVar6,Function);
  SVInt::SVInt(&local_2e8._M_value,(SVIntStorage *)&local_390);
  local_2d8 = '\x01';
  name_05._M_str = "keyCount";
  name_05._M_len = 8;
  MethodBuilder::addArg(&local_d0,name_05,pTVar6,In,(optional<slang::SVInt> *)&local_2e8._M_value);
  if ((local_2d8 == '\x01') &&
     (((local_2d8 = '\0', 0x40 < local_2e8._M_value.super_SVIntStorage.bitWidth ||
       ((local_2e8._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)) &&
      (local_2e8._M_value.super_SVIntStorage.field_0.val != 0)))) {
    operator_delete__((void *)local_2e8._M_value.super_SVIntStorage.field_0);
  }
  MethodBuilder::~MethodBuilder(&local_d0);
  MethodBuilder::~MethodBuilder(&local_80);
  MethodBuilder::~MethodBuilder(&local_120);
  MethodBuilder::~MethodBuilder((MethodBuilder *)&local_340);
  if (((0x40 < (uint)local_390._8_4_) || ((local_390._12_2_ & 0x100) != 0)) &&
     ((void *)local_390._0_8_ != (void *)0x0)) {
    operator_delete__((void *)local_390._0_8_);
  }
  if (((0x40 < local_1a0) || ((local_19c & 0x100) != 0)) && ((void *)local_1a8.val != (void *)0x0))
  {
    operator_delete__(local_1a8.pVal);
  }
  Scope::insertMember(pSVar1,&(local_170.symbol)->super_Symbol,(pPVar5->super_Scope).lastMember,
                      false,true);
  pSVar2 = (c->genericClassAllocator).super_BumpAllocator.head;
  pGVar7 = (GenericClassDefSymbol *)((ulong)(pSVar2->current + 7) & 0xfffffffffffffff8);
  if ((GenericClassDefSymbol *)(c->genericClassAllocator).super_BumpAllocator.endPtr < pGVar7 + 1) {
    pGVar7 = (GenericClassDefSymbol *)
             BumpAllocator::allocateSlow(&(c->genericClassAllocator).super_BumpAllocator,0x2f0,8);
  }
  else {
    pSVar2->current = (byte *)(pGVar7 + 1);
  }
  (pGVar7->super_Symbol).kind = GenericClassDef;
  (pGVar7->super_Symbol).name._M_len = 7;
  (pGVar7->super_Symbol).name._M_str = "mailbox";
  (pGVar7->super_Symbol).location = (SourceLocation)0xffffffffffffffff;
  (pGVar7->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (pGVar7->super_Symbol).parentScope = (Scope *)0x0;
  (pGVar7->super_Symbol).nextInScope = (Symbol *)0x0;
  (pGVar7->super_Symbol).indexInScope = 0;
  pGVar7->isInterface = false;
  (pGVar7->paramDecls).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.data_ =
       (pointer)(pGVar7->paramDecls).
                super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.firstElement;
  (pGVar7->paramDecls).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.len = 0;
  (pGVar7->paramDecls).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.cap = 8;
  (pGVar7->specMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .arrays.groups_size_index = 0x3f;
  (pGVar7->specMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .arrays.groups_size_mask = 1;
  (pGVar7->specMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (pGVar7->specMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (pGVar7->specMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .size_ctrl.ml = 0;
  (pGVar7->specMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .size_ctrl.size = 0;
  (pGVar7->uninstantiatedSpecMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .arrays.groups_size_index = 0x3f;
  (pGVar7->uninstantiatedSpecMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .arrays.groups_size_mask = 1;
  (pGVar7->uninstantiatedSpecMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (pGVar7->uninstantiatedSpecMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (pGVar7->uninstantiatedSpecMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .size_ctrl.ml = 0;
  (pGVar7->uninstantiatedSpecMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .size_ctrl.size = 0;
  (pGVar7->defaultSpecialization).super__Optional_base<const_slang::ast::Type_*,_true,_true>.
  _M_payload.super__Optional_payload_base<const_slang::ast::Type_*>._M_engaged = false;
  pGVar7->firstForward = (ForwardingTypedefSymbol *)0x0;
  pGVar7->recursionDepth = 0;
  (pGVar7->specializeFunc).callback =
       function_ref<void(slang::ast::Compilation&,slang::ast::ClassType&,slang::SourceLocation)>::
       callback_fn<slang::ast::builtins::createMailboxClass(slang::ast::Compilation&)::__0>;
  (pGVar7->specializeFunc).callable = (intptr_t)&local_120;
  pTVar6 = Compilation::getType(c,Untyped);
  name_06._M_str = "T";
  name_06._M_len = 1;
  DefinitionSymbol::ParameterDecl::ParameterDecl
            ((ParameterDecl *)&local_340,name_06,(SourceLocation)0xffffffffffffffff,false,true,
             pTVar6);
  GenericClassDefSymbol::addParameterDecl(pGVar7,(ParameterDecl *)&local_340);
  pPVar5 = local_368;
  pSVar1 = local_3b0;
  Scope::insertMember(local_3b0,&pGVar7->super_Symbol,(local_368->super_Scope).lastMember,false,true
                     );
  name_23._M_str = "randomize";
  name_23._M_len = 9;
  MethodBuilder::MethodBuilder((MethodBuilder *)&local_340,c,name_23,c->intType,Function);
  MethodBuilder::addFlags((MethodBuilder *)&local_340,(bitmask<slang::ast::MethodFlags>)0x400);
  uVar3 = CONCAT15(bStack_333,CONCAT14(uStack_334,local_338));
  MethodBuilder::~MethodBuilder((MethodBuilder *)&local_340);
  Scope::insertMember(pSVar1,(Symbol *)CONCAT26(uStack_332,uVar3),(pPVar5->super_Scope).lastMember,
                      false,true);
  pSVar2 = (c->genericClassAllocator).super_BumpAllocator.head;
  pGVar7 = (GenericClassDefSymbol *)((ulong)(pSVar2->current + 7) & 0xfffffffffffffff8);
  if ((GenericClassDefSymbol *)(c->genericClassAllocator).super_BumpAllocator.endPtr < pGVar7 + 1) {
    pGVar7 = (GenericClassDefSymbol *)
             BumpAllocator::allocateSlow(&(c->genericClassAllocator).super_BumpAllocator,0x2f0,8);
  }
  else {
    pSVar2->current = (byte *)(pGVar7 + 1);
  }
  (pGVar7->super_Symbol).kind = GenericClassDef;
  (pGVar7->super_Symbol).name._M_len = 0xe;
  (pGVar7->super_Symbol).name._M_str = "weak_reference";
  (pGVar7->super_Symbol).location = (SourceLocation)0xffffffffffffffff;
  (pGVar7->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (pGVar7->super_Symbol).parentScope = (Scope *)0x0;
  (pGVar7->super_Symbol).nextInScope = (Symbol *)0x0;
  (pGVar7->super_Symbol).indexInScope = 0;
  pGVar7->isInterface = false;
  (pGVar7->paramDecls).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.data_ =
       (pointer)(pGVar7->paramDecls).
                super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.firstElement;
  (pGVar7->paramDecls).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.len = 0;
  (pGVar7->paramDecls).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.cap = 8;
  (pGVar7->specMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .arrays.groups_size_index = 0x3f;
  (pGVar7->specMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .arrays.groups_size_mask = 1;
  (pGVar7->specMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (pGVar7->specMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (pGVar7->specMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .size_ctrl.ml = 0;
  (pGVar7->specMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .size_ctrl.size = 0;
  (pGVar7->uninstantiatedSpecMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .arrays.groups_size_index = 0x3f;
  (pGVar7->uninstantiatedSpecMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .arrays.groups_size_mask = 1;
  (pGVar7->uninstantiatedSpecMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (pGVar7->uninstantiatedSpecMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (pGVar7->uninstantiatedSpecMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .size_ctrl.ml = 0;
  (pGVar7->uninstantiatedSpecMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  .size_ctrl.size = 0;
  (pGVar7->defaultSpecialization).super__Optional_base<const_slang::ast::Type_*,_true,_true>.
  _M_payload.super__Optional_payload_base<const_slang::ast::Type_*>._M_engaged = false;
  pGVar7->firstForward = (ForwardingTypedefSymbol *)0x0;
  pGVar7->recursionDepth = 0;
  (pGVar7->specializeFunc).callback =
       function_ref<void(slang::ast::Compilation&,slang::ast::ClassType&,slang::SourceLocation)>::
       callback_fn<slang::ast::builtins::createWeakReference(slang::ast::Compilation&)::__0>;
  (pGVar7->specializeFunc).callable = (intptr_t)&local_120;
  name_07._M_str = "T";
  name_07._M_len = 1;
  DefinitionSymbol::ParameterDecl::ParameterDecl
            ((ParameterDecl *)&local_340,name_07,(SourceLocation)0xffffffffffffffff,false,true,
             (Type *)0x0);
  GenericClassDefSymbol::addParameterDecl(pGVar7,(ParameterDecl *)&local_340);
  Scope::insertMember(local_3b0,&pGVar7->super_Symbol,(pPVar5->super_Scope).lastMember,false,true);
  return pPVar5;
}

Assistant:

const PackageSymbol& createStdPackage(Compilation& c) {
    auto pkg = c.emplace<PackageSymbol>(c, "std", NL, c.getWireNetType(), VariableLifetime::Static);
    pkg->addMember(createProcessClass(c));
    pkg->addMember(createSemaphoreClass(c));
    pkg->addMember(createMailboxClass(c));
    pkg->addMember(createRandomizeFunc(c));
    pkg->addMember(createWeakReference(c));

    return *pkg;
}